

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::cannotBuildNodeDueToMultipleProducers
          (BuildSystemFrontendDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  Command *pCVar1;
  bool bVar2;
  reference ppCVar3;
  raw_ostream *prVar4;
  void *__ptr;
  size_t __size;
  StringRef SVar5;
  __normal_iterator<llbuild::buildsystem::Command_**,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
  local_a8;
  Command *local_a0;
  Command *cmd;
  iterator __end1;
  iterator __begin1;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *__range1;
  undefined1 local_70 [8];
  raw_string_ostream messageStream;
  string message;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  *commands_local;
  Node *output_local;
  BuildSystemFrontendDelegate *this_local;
  
  std::__cxx11::string::string((string *)&messageStream.OS);
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)local_70,(string *)&messageStream.OS);
  llvm::raw_ostream::operator<<((raw_ostream *)local_70,"unable to build node: \'");
  SVar5 = Node::getName(output);
  llvm::raw_ostream::operator<<((raw_ostream *)local_70,SVar5);
  llvm::raw_ostream::operator<<
            ((raw_ostream *)local_70,"\' (node is produced by multiple commands: \'");
  __end1 = std::
           vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
           ::begin(commands);
  cmd = (Command *)
        std::
        vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
        end(commands);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<llbuild::buildsystem::Command_**,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
                                *)&cmd);
    if (!bVar2) break;
    ppCVar3 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::Command_**,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
              ::operator*(&__end1);
    pCVar1 = *ppCVar3;
    local_a0 = pCVar1;
    local_a8._M_current =
         (Command **)
         std::
         vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
         begin(commands);
    ppCVar3 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::Command_**,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
              ::operator*(&local_a8);
    if (pCVar1 != *ppCVar3) {
      llvm::raw_ostream::operator<<((raw_ostream *)local_70,", ");
    }
    prVar4 = llvm::raw_ostream::operator<<((raw_ostream *)local_70,"\'");
    SVar5 = Command::getName(local_a0);
    prVar4 = llvm::raw_ostream::operator<<(prVar4,SVar5);
    llvm::raw_ostream::operator<<(prVar4,"\'");
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::Command_**,_std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>_>
    ::operator++(&__end1);
  }
  llvm::raw_ostream::flush((raw_ostream *)local_70);
  __ptr = (void *)std::__cxx11::string::data();
  __size = std::__cxx11::string::size();
  fwrite(__ptr,__size,1,_stderr);
  fflush(_stderr);
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_70);
  std::__cxx11::string::~string((string *)&messageStream.OS);
  return;
}

Assistant:

void BuildSystemFrontendDelegate::cannotBuildNodeDueToMultipleProducers(
     Node *output, std::vector<Command*> commands) {
  std::string message;
  llvm::raw_string_ostream messageStream(message);

  messageStream << "unable to build node: '";
  messageStream << output->getName();
  messageStream << "' (node is produced by multiple commands: '";

  for (Command* cmd : commands) {
    if (cmd != *commands.begin()) {
      messageStream << ", ";
    }
    messageStream << "'" << cmd->getName() << "'";
  }

  messageStream.flush();
  fwrite(message.data(), message.size(), 1, stderr);
  fflush(stderr);
}